

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimerQueue.cpp
# Opt level: O0

timespec mario::detail::howMuchTimeFromNow(Timestamp when)

{
  timespec tVar1;
  int64_t iVar2;
  int64_t iVar3;
  Timestamp local_30;
  long local_28;
  int64_t microseconds;
  Timestamp when_local;
  timespec ts;
  
  microseconds = when._microSecondsSinceEpoch;
  iVar2 = Timestamp::microSecondsSinceEpoch((Timestamp *)&microseconds);
  local_30 = Timestamp::now();
  iVar3 = Timestamp::microSecondsSinceEpoch(&local_30);
  local_28 = iVar2 - iVar3;
  if (local_28 < 100) {
    local_28 = 100;
  }
  tVar1.tv_nsec = (local_28 % 1000000) * 1000;
  tVar1.tv_sec = local_28 / 1000000;
  return tVar1;
}

Assistant:

struct timespec howMuchTimeFromNow(Timestamp when) {
    int64_t microseconds = when.microSecondsSinceEpoch()
        - Timestamp::now().microSecondsSinceEpoch();
    if (microseconds < 100) {
        microseconds = 100;
    }

    struct timespec ts;
    ts.tv_sec = static_cast<time_t>(microseconds / Timestamp::kMicroSecondsPerSecond);
    ts.tv_nsec = static_cast<long>((microseconds % Timestamp::kMicroSecondsPerSecond) * 1000);

    return ts;
}